

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

int google::protobuf::GlobalReplaceSubstring(string *substring,string *replacement,string *s)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  int iVar1;
  LogMessage *other;
  int iVar2;
  int iVar3;
  undefined1 local_78 [8];
  string tmp;
  LogFinisher local_31;
  
  if (s == (string *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)local_78,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/stubs/strutil.cc"
               ,0x658);
    other = internal::LogMessage::operator<<((LogMessage *)local_78,"CHECK failed: s != nullptr: ");
    internal::LogFinisher::operator=(&local_31,other);
    internal::LogMessage::~LogMessage((LogMessage *)local_78);
  }
  iVar2 = 0;
  if ((s->_M_string_length != 0) && (iVar2 = 0, substring->_M_string_length != 0)) {
    local_78 = (undefined1  [8])&tmp._M_string_length;
    tmp._M_dataplus._M_p = (pointer)0x0;
    tmp._M_string_length._0_1_ = 0;
    iVar2 = 0;
    iVar1 = std::__cxx11::string::find((char *)s,(ulong)(substring->_M_dataplus)._M_p,0);
    iVar3 = 0;
    while (iVar1 != -1) {
      std::__cxx11::string::append((string *)local_78,(ulong)s,(long)iVar3);
      __first._M_current = (replacement->_M_dataplus)._M_p;
      std::__cxx11::string::
      append<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,void>
                ((string *)local_78,__first,
                 (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )(__first._M_current + replacement->_M_string_length));
      iVar3 = iVar1 + (int)substring->_M_string_length;
      iVar1 = std::__cxx11::string::find((char *)s,(ulong)(substring->_M_dataplus)._M_p,(long)iVar3)
      ;
      iVar2 = iVar2 + 1;
    }
    if (iVar2 != 0) {
      std::__cxx11::string::append((string *)local_78,(ulong)s,(long)iVar3);
      std::__cxx11::string::swap((string *)s);
    }
    std::__cxx11::string::~string((string *)local_78);
  }
  return iVar2;
}

Assistant:

int GlobalReplaceSubstring(const string& substring,
                           const string& replacement,
                           string* s) {
  GOOGLE_CHECK(s != nullptr);
  if (s->empty() || substring.empty())
    return 0;
  string tmp;
  int num_replacements = 0;
  int pos = 0;
  for (int match_pos = s->find(substring.data(), pos, substring.length());
       match_pos != string::npos;
       pos = match_pos + substring.length(),
           match_pos = s->find(substring.data(), pos, substring.length())) {
    ++num_replacements;
    // Append the original content before the match.
    tmp.append(*s, pos, match_pos - pos);
    // Append the replacement for the match.
    tmp.append(replacement.begin(), replacement.end());
  }
  // Append the content after the last match. If no replacements were made, the
  // original string is left untouched.
  if (num_replacements > 0) {
    tmp.append(*s, pos, s->length() - pos);
    s->swap(tmp);
  }
  return num_replacements;
}